

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printWhile(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"while");
  space(this);
  emit(this,'(');
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar1);
  emit(this,')');
  space(this);
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar1,"{}");
  return;
}

Assistant:

void printWhile(Ref node) {
    emit("while");
    space();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    print(node[2], "{}");
  }